

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_parse_result * __thiscall
pugi::xml_document::load_buffer
          (xml_document *this,void *contents,size_t size,uint options,xml_encoding encoding)

{
  xml_parse_result *in_RDI;
  bool in_stack_00000012;
  bool in_stack_00000013;
  uint in_stack_00000014;
  size_t in_stack_00000018;
  void *in_stack_00000020;
  xml_node_struct *in_stack_00000028;
  xml_document_struct *in_stack_00000030;
  char_t **in_stack_00000058;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  
  reset((xml_document *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  impl::anon_unknown_0::load_buffer_impl
            (in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018,
             in_stack_00000014,(xml_encoding)size,in_stack_00000013,in_stack_00000012,
             in_stack_00000058);
  return in_RDI;
}

Assistant:

PUGI_IMPL_FN xml_parse_result xml_document::load_buffer(const void* contents, size_t size, unsigned int options, xml_encoding encoding)
	{
		reset();

		return impl::load_buffer_impl(static_cast<impl::xml_document_struct*>(_root), _root, const_cast<void*>(contents), size, options, encoding, false, false, &_buffer);
	}